

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-configure.c
# Opt level: O0

int run_test_loop_configure(void)

{
  int iVar1;
  undefined1 local_3f0 [8];
  uv_loop_t loop;
  uv_timer_t timer_handle;
  
  iVar1 = uv_loop_init(local_3f0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x1b,"0 == uv_loop_init(&loop)");
    abort();
  }
  iVar1 = uv_loop_configure(local_3f0,0,0x1b);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x1f,"0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF)");
    abort();
  }
  iVar1 = uv_timer_init(local_3f0,&loop.inotify_fd);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x21,"0 == uv_timer_init(&loop, &timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start(&loop.inotify_fd,timer_cb,10,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x22,"0 == uv_timer_start(&timer_handle, timer_cb, 10, 0)");
    abort();
  }
  iVar1 = uv_run(local_3f0,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x23,"0 == uv_run(&loop, UV_RUN_DEFAULT)");
    abort();
  }
  iVar1 = uv_loop_close(local_3f0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-configure.c"
            ,0x24,"0 == uv_loop_close(&loop)");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_configure) {
  uv_timer_t timer_handle;
  uv_loop_t loop;
  ASSERT(0 == uv_loop_init(&loop));
#ifdef _WIN32
  ASSERT(UV_ENOSYS == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, 0));
#else
  ASSERT(0 == uv_loop_configure(&loop, UV_LOOP_BLOCK_SIGNAL, SIGPROF));
#endif
  ASSERT(0 == uv_timer_init(&loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));
  ASSERT(0 == uv_loop_close(&loop));
  return 0;
}